

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
embree::CommandLineParser::parseCommandLine
          (CommandLineParser *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  iterator iVar6;
  ParseStream *local_b8;
  FileName *local_b0;
  _Base_ptr local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
  *local_a0;
  CommandLineParser *local_98;
  string tag;
  string tag0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0 = &this->commandLineOptionMap;
  local_a8 = &(this->commandLineOptionMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0 = path;
  local_98 = this;
  do {
    Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (&tag,&cin->ptr->
                     super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    bVar2 = std::operator==(&tag,"");
    if (bVar2) {
      std::__cxx11::string::~string((string *)&tag);
      return;
    }
    std::__cxx11::string::string((string *)&tag0,(string *)&tag);
    lVar3 = std::__cxx11::string::find((char *)&tag,0x226b0f);
    if (lVar3 == 0) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)&tag);
      std::__cxx11::string::operator=((string *)&tag,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar3 = std::__cxx11::string::find((char *)&tag,0x226b0f);
      if (lVar3 == 0) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&tag);
        std::__cxx11::string::operator=((string *)&tag,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>_>
              ::find(&local_a0->_M_t,&tag);
      if (iVar6._M_node == local_a8) goto LAB_0013148e;
      plVar1 = *(long **)(iVar6._M_node + 2);
      local_b8 = cin->ptr;
      if (local_b8 != (ParseStream *)0x0) {
        (*(local_b8->
          super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_RefCount._vptr_RefCount[2])();
      }
      (**(code **)(*plVar1 + 0x20))(plVar1,&local_b8,local_b0);
      if (local_b8 != (ParseStream *)0x0) {
        (*(local_b8->
          super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).super_RefCount._vptr_RefCount[3])();
      }
    }
    else {
LAB_0013148e:
      if (local_98->verbosity != SILENT) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"unknown command line parameter: ");
        poVar4 = std::operator<<(poVar4,(string *)&tag0);
        std::operator<<(poVar4," ");
        while( true ) {
          pbVar5 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::peek(&cin->ptr->
                           super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         );
          bVar2 = std::operator!=(pbVar5,"");
          if (!bVar2) break;
          pbVar5 = Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::peek(&cin->ptr->
                           super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         );
          if (*(pbVar5->_M_dataplus)._M_p == '-') break;
          Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          get(&local_50,
              &cin->ptr->
               super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
          std::operator<<(poVar4," ");
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
    }
    std::__cxx11::string::~string((string *)&tag0);
    std::__cxx11::string::~string((string *)&tag);
  } while( true );
}

Assistant:

void CommandLineParser::parseCommandLine(Ref<ParseStream> cin, const FileName& path)
  {
    while (true)
    {
      std::string tag = cin->getString();
      if (tag == "") return;
      std::string tag0 = tag;
      
      /* remove - or -- and lookup command line option */
      if (tag.find("-") == 0) 
      {
        tag = tag.substr(1);
        if (tag.find("-") == 0) tag = tag.substr(1);
        auto option = commandLineOptionMap.find(tag);
      
        /* process command line option */
        if (option != commandLineOptionMap.end()) {
          option->second->parse(cin,path);
          continue;
        }
      }
      
      if (verbosity != SILENT) {
        /* handle unknown command line options */
        std::cerr << "unknown command line parameter: " << tag0 << " ";
        while (cin->peek() != "" && cin->peek()[0] != '-') std::cerr << cin->getString() << " ";
        std::cerr << std::endl;
      }
    }
  }